

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModeXCodeRecord.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::ModeXCodeRecord::Decode(ModeXCodeRecord *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  ModeXCodeRecord *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 2) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  KDataStream::operator>>(local_18,&(this->m_CodeUnion).m_ui16Code);
  return;
}

Assistant:

void ModeXCodeRecord::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < MODE_X_CODE_RECORD_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );
	stream >> m_CodeUnion.m_ui16Code;
}